

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Thread::Mark(Thread *this,Store *store)

{
  bool bVar1;
  reference this_00;
  reference puVar2;
  reference pvVar3;
  iterator iStack_50;
  uint index;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  Frame *frame;
  iterator __end2;
  iterator __begin2;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *__range2;
  Store *store_local;
  Thread *this_local;
  
  __end2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::begin
                     (&this->frames_);
  frame = (Frame *)std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::end
                             (&this->frames_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::interp::Frame_*,_std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>_>
                                *)&frame);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::interp::Frame_*,_std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>_>
              ::operator*(&__end2);
    Frame::Mark(this_00,store);
    __gnu_cxx::
    __normal_iterator<wabt::interp::Frame_*,_std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->refs_);
  iStack_50 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->refs_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2_1);
    pvVar3 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                       (&this->values_,(ulong)*puVar2);
    Store::Mark(store,(Ref)(pvVar3->ref_).index);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2_1);
  }
  return;
}

Assistant:

void Thread::Mark(Store& store) {
  for (auto&& frame : frames_) {
    frame.Mark(store);
  }
  for (auto index: refs_) {
    store.Mark(values_[index].ref_);
  }
}